

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O2

void __thiscall TPZDohrSubstruct<float>::TPZDohrSubstruct(TPZDohrSubstruct<float> *this)

{
  TPZAutoPointer<TPZMatrix<float>_> local_a8;
  TPZAutoPointer<TPZMatrix<float>_> local_a0;
  TPZAutoPointer<TPZMatrix<float>_> local_98;
  TPZAutoPointer<TPZMatrix<float>_> local_90;
  TPZStepSolver<float> *local_88;
  TPZFMatrix<float> *local_80;
  TPZAutoPointer<TPZMatrix<float>_> *local_78;
  TPZManVector<float,_10> *local_70;
  TPZFMatrix<float> *local_68;
  TPZFMatrix<float> *local_60;
  TPZFMatrix<float> *local_58;
  TPZFMatrix<float> *local_50;
  TPZStepSolver<float> *local_48;
  TPZFMatrix<float> *local_40;
  TPZFMatrix<float> *local_38;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZDohrSubstruct_01820648;
  TPZFMatrix<float>::TPZFMatrix(&this->fC_star);
  local_38 = &this->fC_star;
  TPZFMatrix<float>::TPZFMatrix(&this->fKeC_star);
  local_40 = &this->fKeC_star;
  TPZAutoPointer<TPZMatrix<float>_>::TPZAutoPointer(&local_90,(TPZMatrix<float> *)0x0);
  TPZStepSolver<float>::TPZStepSolver(&this->finv,&local_90);
  TPZAutoPointer<TPZMatrix<float>_>::~TPZAutoPointer(&local_90);
  local_50 = &this->fNullPivots;
  local_48 = &this->finv;
  TPZFMatrix<float>::TPZFMatrix(local_50);
  (this->fCoarseNodes)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  (this->fCoarseNodes).fStore = (int *)0x0;
  (this->fCoarseNodes).fNElements = 0;
  (this->fCoarseNodes).fNAlloc = 0;
  local_58 = &this->fC;
  TPZFMatrix<float>::TPZFMatrix(local_58);
  local_60 = &this->fPhiC;
  TPZFMatrix<float>::TPZFMatrix(local_60);
  local_68 = &this->fPhiC_Weighted_Condensed;
  TPZFMatrix<float>::TPZFMatrix(local_68);
  (this->fCoarseIndex)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  (this->fCoarseIndex).fStore = (int *)0x0;
  (this->fCoarseIndex).fNElements = 0;
  (this->fCoarseIndex).fNAlloc = 0;
  local_70 = &this->fWeights;
  TPZManVector<float,_10>::TPZManVector(local_70,0);
  local_78 = &this->fStiffness;
  TPZAutoPointer<TPZMatrix<float>_>::TPZAutoPointer(local_78);
  local_80 = &this->fKCi;
  TPZFMatrix<float>::TPZFMatrix(local_80);
  (this->fGlobalIndex)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  (this->fGlobalIndex).fNAlloc = 0;
  (this->fGlobalIndex).fStore = (int *)0x0;
  (this->fGlobalIndex).fNElements = 0;
  (this->fGlobalEqs)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_016f3038;
  (this->fGlobalEqs).fStore = (pair<int,_int> *)0x0;
  (this->fGlobalEqs).fNElements = 0;
  (this->fGlobalEqs).fNAlloc = 0;
  TPZAutoPointer<TPZMatrix<float>_>::TPZAutoPointer(&local_98,(TPZMatrix<float> *)0x0);
  local_88 = &this->fInvertedStiffness;
  TPZStepSolver<float>::TPZStepSolver(local_88,&local_98);
  TPZAutoPointer<TPZMatrix<float>_>::~TPZAutoPointer(&local_98);
  TPZAutoPointer<TPZMatrix<float>_>::TPZAutoPointer(&local_a0,(TPZMatrix<float> *)0x0);
  TPZStepSolver<float>::TPZStepSolver(&this->fInvertedInternalStiffness,&local_a0);
  TPZAutoPointer<TPZMatrix<float>_>::~TPZAutoPointer(&local_a0);
  TPZAutoPointer<TPZMatrix<float>_>::TPZAutoPointer(&local_a8,(TPZMatrix<float> *)0x0);
  TPZStepSolver<float>::TPZStepSolver(&this->fKCInvert,&local_a8);
  TPZAutoPointer<TPZMatrix<float>_>::~TPZAutoPointer(&local_a8);
  (this->fInternalEqs)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  (this->fInternalEqs).fNAlloc = 0;
  (this->fInternalEqs).fStore = (int *)0x0;
  (this->fInternalEqs).fNElements = 0;
  (this->fBoundaryEqs)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  (this->fBoundaryEqs).fStore = (int *)0x0;
  (this->fBoundaryEqs).fNElements = 0;
  (this->fBoundaryEqs).fNAlloc = 0;
  TPZFMatrix<float>::TPZFMatrix(&this->fLocalLoad);
  TPZFMatrix<float>::TPZFMatrix(&this->fLocalWeightedResidual);
  TPZFMatrix<float>::TPZFMatrix(&this->fzi);
  TPZFMatrix<float>::TPZFMatrix(&this->fAdjustSolution);
  return;
}

Assistant:

TPZDohrSubstruct<TVar>::TPZDohrSubstruct()
{
	//Inicializacao
}